

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::AddBoneChildren(SMDImporter *this,aiNode *pcNode,uint32_t iParent)

{
  aiMatrix4x4 *paVar1;
  pointer pMVar2;
  pointer pBVar3;
  pointer pBVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  aiNode **ppaVar20;
  aiNode *this_00;
  ulong uVar21;
  uint uVar22;
  pointer pBVar23;
  uint uVar24;
  aiMatrix4x4t<float> temp;
  uint local_84;
  aiMatrix4x4t<float> local_78;
  
  if (pcNode == (aiNode *)0x0) {
    __assert_fail("nullptr != pcNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19a,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  if (pcNode->mNumChildren == 0) {
    if (pcNode->mChildren == (aiNode **)0x0) {
      uVar22 = 0;
      uVar24 = 0;
      while( true ) {
        pBVar23 = (this->asBones).
                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->asBones).
                           super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar23) / 0x90) <=
            (ulong)uVar24) break;
        if (pBVar23[uVar24].iParent == iParent) {
          uVar22 = uVar22 + 1;
          pcNode->mNumChildren = uVar22;
        }
        uVar24 = uVar24 + 1;
      }
      ppaVar20 = (aiNode **)operator_new__((ulong)uVar22 << 3);
      pcNode->mChildren = ppaVar20;
      uVar22 = 0;
      local_84 = 0;
      while( true ) {
        uVar21 = (ulong)uVar22;
        pBVar23 = (this->asBones).
                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->asBones).
                           super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar23) / 0x90) <=
            uVar21) break;
        if (pBVar23[uVar21].iParent == iParent) {
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          pBVar23 = pBVar23 + uVar21;
          pcNode->mChildren[local_84] = this_00;
          uVar21 = (pBVar23->mName)._M_string_length;
          if (uVar21 < 0x400) {
            (this_00->mName).length = (ai_uint32)uVar21;
            memcpy((this_00->mName).data,(pBVar23->mName)._M_dataplus._M_p,uVar21);
            (this_00->mName).data[uVar21] = '\0';
          }
          pMVar2 = (pBVar23->sAnim).asKeys.
                   super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pBVar23->sAnim).asKeys.
                       super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
               + 8) != pMVar2) {
            fVar16 = (pMVar2->matrix).a1;
            fVar17 = (pMVar2->matrix).a2;
            fVar18 = (pMVar2->matrix).a3;
            fVar19 = (pMVar2->matrix).a4;
            fVar12 = (pMVar2->matrix).b1;
            fVar13 = (pMVar2->matrix).b2;
            fVar14 = (pMVar2->matrix).b3;
            fVar15 = (pMVar2->matrix).b4;
            fVar8 = (pMVar2->matrix).c1;
            fVar9 = (pMVar2->matrix).c2;
            fVar10 = (pMVar2->matrix).c3;
            fVar11 = (pMVar2->matrix).c4;
            fVar5 = (pMVar2->matrix).d2;
            fVar6 = (pMVar2->matrix).d3;
            fVar7 = (pMVar2->matrix).d4;
            (this_00->mTransformation).d1 = (pMVar2->matrix).d1;
            (this_00->mTransformation).d2 = fVar5;
            (this_00->mTransformation).d3 = fVar6;
            (this_00->mTransformation).d4 = fVar7;
            (this_00->mTransformation).c1 = fVar8;
            (this_00->mTransformation).c2 = fVar9;
            (this_00->mTransformation).c3 = fVar10;
            (this_00->mTransformation).c4 = fVar11;
            (this_00->mTransformation).b1 = fVar12;
            (this_00->mTransformation).b2 = fVar13;
            (this_00->mTransformation).b3 = fVar14;
            (this_00->mTransformation).b4 = fVar15;
            (this_00->mTransformation).a1 = fVar16;
            (this_00->mTransformation).a2 = fVar17;
            (this_00->mTransformation).a3 = fVar18;
            (this_00->mTransformation).a4 = fVar19;
          }
          uVar21 = (ulong)pBVar23->iParent;
          if (uVar21 == 0xffffffff) {
            fVar16 = (this_00->mTransformation).a1;
            fVar17 = (this_00->mTransformation).a2;
            fVar18 = (this_00->mTransformation).a3;
            fVar19 = (this_00->mTransformation).a4;
            fVar12 = (this_00->mTransformation).b1;
            fVar13 = (this_00->mTransformation).b2;
            fVar14 = (this_00->mTransformation).b3;
            fVar15 = (this_00->mTransformation).b4;
            fVar8 = (this_00->mTransformation).c1;
            fVar9 = (this_00->mTransformation).c2;
            fVar10 = (this_00->mTransformation).c3;
            fVar11 = (this_00->mTransformation).c4;
            fVar5 = (this_00->mTransformation).d2;
            fVar6 = (this_00->mTransformation).d3;
            fVar7 = (this_00->mTransformation).d4;
            (pBVar23->mOffsetMatrix).d1 = (this_00->mTransformation).d1;
            (pBVar23->mOffsetMatrix).d2 = fVar5;
            (pBVar23->mOffsetMatrix).d3 = fVar6;
            (pBVar23->mOffsetMatrix).d4 = fVar7;
            (pBVar23->mOffsetMatrix).c1 = fVar8;
            (pBVar23->mOffsetMatrix).c2 = fVar9;
            (pBVar23->mOffsetMatrix).c3 = fVar10;
            (pBVar23->mOffsetMatrix).c4 = fVar11;
            (pBVar23->mOffsetMatrix).b1 = fVar12;
            (pBVar23->mOffsetMatrix).b2 = fVar13;
            (pBVar23->mOffsetMatrix).b3 = fVar14;
            (pBVar23->mOffsetMatrix).b4 = fVar15;
            (pBVar23->mOffsetMatrix).a1 = fVar16;
            (pBVar23->mOffsetMatrix).a2 = fVar17;
            (pBVar23->mOffsetMatrix).a3 = fVar18;
            (pBVar23->mOffsetMatrix).a4 = fVar19;
          }
          else {
            pBVar3 = (this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            paVar1 = &pBVar3[uVar21].mOffsetMatrix;
            local_78.a1 = paVar1->a1;
            local_78.a2 = paVar1->a2;
            local_78.a3 = paVar1->a3;
            local_78.a4 = paVar1->a4;
            pBVar4 = pBVar3 + uVar21;
            local_78.b1 = (pBVar4->mOffsetMatrix).b1;
            local_78.b2 = (pBVar4->mOffsetMatrix).b2;
            local_78._24_8_ = *(undefined8 *)(&(pBVar4->mOffsetMatrix).b1 + 2);
            pBVar4 = pBVar3 + uVar21;
            local_78.c1 = (pBVar4->mOffsetMatrix).c1;
            local_78.c2 = (pBVar4->mOffsetMatrix).c2;
            local_78._40_8_ = *(undefined8 *)(&(pBVar4->mOffsetMatrix).c1 + 2);
            pBVar3 = pBVar3 + uVar21;
            local_78.d1 = (pBVar3->mOffsetMatrix).d1;
            local_78.d2 = (pBVar3->mOffsetMatrix).d2;
            local_78._56_8_ = *(undefined8 *)(&(pBVar3->mOffsetMatrix).d1 + 2);
            aiMatrix4x4t<float>::operator*=(&local_78,&this_00->mTransformation);
            (pBVar23->mOffsetMatrix).a1 = local_78.a1;
            (pBVar23->mOffsetMatrix).a2 = local_78.a2;
            (pBVar23->mOffsetMatrix).a3 = local_78.a3;
            (pBVar23->mOffsetMatrix).a4 = local_78.a4;
            (pBVar23->mOffsetMatrix).b1 = local_78.b1;
            (pBVar23->mOffsetMatrix).b2 = local_78.b2;
            (pBVar23->mOffsetMatrix).b3 = local_78.b3;
            (pBVar23->mOffsetMatrix).b4 = local_78.b4;
            (pBVar23->mOffsetMatrix).c1 = local_78.c1;
            (pBVar23->mOffsetMatrix).c2 = local_78.c2;
            (pBVar23->mOffsetMatrix).c3 = local_78.c3;
            (pBVar23->mOffsetMatrix).c4 = local_78.c4;
            (pBVar23->mOffsetMatrix).d1 = local_78.d1;
            (pBVar23->mOffsetMatrix).d2 = local_78.d2;
            (pBVar23->mOffsetMatrix).d3 = local_78.d3;
            (pBVar23->mOffsetMatrix).d4 = local_78.d4;
          }
          local_84 = local_84 + 1;
          this_00->mParent = pcNode;
          AddBoneChildren(this,this_00,uVar22);
        }
        uVar22 = uVar22 + 1;
      }
      return;
    }
    __assert_fail("nullptr == pcNode->mChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                  ,0x19c,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
  }
  __assert_fail("0 == pcNode->mNumChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                ,0x19b,"void Assimp::SMDImporter::AddBoneChildren(aiNode *, uint32_t)");
}

Assistant:

void SMDImporter::AddBoneChildren(aiNode* pcNode, uint32_t iParent) {
    ai_assert( nullptr != pcNode );
    ai_assert( 0 == pcNode->mNumChildren );
    ai_assert( nullptr == pcNode->mChildren);

    // first count ...
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent == iParent) {
            ++pcNode->mNumChildren;
        }
    }

    // now allocate the output array
    pcNode->mChildren = new aiNode*[pcNode->mNumChildren];

    // and fill all subnodes
    unsigned int qq( 0 );
    for (unsigned int i = 0; i < asBones.size();++i) {
        SMD::Bone& bone = asBones[i];
        if (bone.iParent != iParent) {
            continue;
        }

        aiNode* pc = pcNode->mChildren[qq++] = new aiNode();
        pc->mName.Set(bone.mName);

        // store the local transformation matrix of the bind pose
        if (bone.sAnim.asKeys.size()) {
            pc->mTransformation = bone.sAnim.asKeys[0].matrix;
        }

        if (bone.iParent == static_cast<uint32_t>(-1)) { 
            bone.mOffsetMatrix = pc->mTransformation;
        } else {
            bone.mOffsetMatrix = asBones[bone.iParent].mOffsetMatrix * pc->mTransformation;
        }

        pc->mParent = pcNode;

        // add children to this node, too
        AddBoneChildren(pc,i);
    }
}